

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *__s;
  size_t sVar1;
  char *__s_00;
  ostringstream msg;
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Policy ",7);
  __s = idToString((PolicyID)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," is not set: ",0xd);
  __s_00 = idToShortDescription((PolicyID)this);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s_00,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"  Run \"cmake --help-policy ",0x1b);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
             ,0x60);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  std::ostringstream msg;
  msg <<
    "Policy " << idToString(id) << " is not set: "
    "" << idToShortDescription(id) << "  "
    "Run \"cmake --help-policy " << idToString(id) << "\" for "
    "policy details.  "
    "Use the cmake_policy command to set the policy "
    "and suppress this warning.";
  return msg.str();
}